

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzv3dmesh.cpp
# Opt level: O1

void __thiscall TPZV3DGraphMesh::SequenceNodes(TPZV3DGraphMesh *this)

{
  long lVar1;
  TPZGraphNode *this_00;
  int64_t iVar2;
  long nelem;
  
  TPZGraphMesh::SequenceNodes(&this->super_TPZGraphMesh);
  lVar1 = (this->super_TPZGraphMesh).fNodeMap.super_TPZChunkVector<TPZGraphNode,_10>.fNElements;
  if (0 < lVar1) {
    nelem = 0;
    do {
      this_00 = TPZChunkVector<TPZGraphNode,_10>::operator[]
                          (&(this->super_TPZGraphMesh).fNodeMap.
                            super_TPZChunkVector<TPZGraphNode,_10>,nelem);
      iVar2 = TPZGraphNode::FirstPoint(this_00);
      TPZGraphNode::SetPointNumber(this_00,iVar2 + 1);
      nelem = nelem + 1;
    } while (lVar1 != nelem);
  }
  return;
}

Assistant:

void TPZV3DGraphMesh::SequenceNodes(){
	TPZGraphMesh::SequenceNodes();
	int64_t nnod = fNodeMap.NElements();
	for(int64_t i=0;i<nnod;i++) {
		TPZGraphNode *n = &fNodeMap[i];
		if(n) n->SetPointNumber(n->FirstPoint()+1);
	}
}